

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void * tcmalloc::LowLevelAlloc::AllocWithArena(size_t request,Arena *arena)

{
  AllocList *head;
  long *plVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  AllocList *pAVar6;
  undefined8 extraout_RDX;
  char *pcVar7;
  int *piVar8;
  ulong size;
  bool bVar9;
  AllocList *local_138;
  AllocList *prev [30];
  SpinLockHolder local_38;
  SpinLockHolder locker;
  undefined4 extraout_var;
  
  if (request == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    if ((arena == (Arena *)0x0) &&
       (arena = DefaultArena::arena, DefaultArena::arena == (Arena *)0x0)) {
      Arena::Arena((Arena *)&default_arena_storage);
      DefaultArena::arena = (Arena *)&default_arena_storage;
      arena = DefaultArena::arena;
    }
    LOCK();
    bVar9 = (arena->mu).lockword_.super___atomic_base<int>._M_i == 0;
    if (bVar9) {
      (arena->mu).lockword_.super___atomic_base<int>._M_i = 1;
    }
    UNLOCK();
    local_38.lock_ = &arena->mu;
    if (!bVar9) {
      SpinLock::SlowLock(&arena->mu);
    }
    size = -arena->roundup & request + arena->roundup + 0x1f;
    head = &arena->freelist;
    prev[0x1d] = (AllocList *)(size + 0xfffff & 0xfffffffffff00000);
    do {
      iVar3 = LLA_SkiplistLevels(size,arena->min_size,false);
      if ((arena->freelist).levels < iVar3) {
LAB_00125454:
        LOCK();
        iVar3 = (arena->mu).lockword_.super___atomic_base<int>._M_i;
        (arena->mu).lockword_.super___atomic_base<int>._M_i = 0;
        UNLOCK();
        if (iVar3 != 1) {
          SpinLock::SlowUnlock(&arena->mu);
        }
        iVar3 = (*arena->allocator->_vptr_PagesAllocator[2])(arena->allocator,prev[0x1d]);
        puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar3);
        LOCK();
        bVar9 = (arena->mu).lockword_.super___atomic_base<int>._M_i == 0;
        if (bVar9) {
          (arena->mu).lockword_.super___atomic_base<int>._M_i = 1;
        }
        UNLOCK();
        if (!bVar9) {
          SpinLock::SlowLock(&arena->mu);
        }
        *puVar4 = extraout_RDX;
        puVar4[1] = (ulong)puVar4 ^ 0x4c833e95;
        puVar4[2] = arena;
        AddToFreelist(puVar4 + 4,arena);
        bVar9 = false;
      }
      else {
        pAVar6 = head;
        while( true ) {
          if (pAVar6->levels < iVar3) {
            pcVar7 = "Check failed: i < prev->levels: too few levels in Next()\n";
            uVar5 = 0x39;
            goto LAB_001255b5;
          }
          request = (size_t)pAVar6->next[iVar3 - 1];
          if ((AllocList *)request == (AllocList *)0x0) break;
          if (((((AllocList *)request)->header).magic ^ request) != 0xffffffffb37cc16a) {
            pcVar7 = 
            "Check failed: next->header.magic == Magic(kMagicUnallocated, &next->header): bad magic number in Next()\n"
            ;
            uVar5 = 0x68;
            goto LAB_001255b5;
          }
          if ((((AllocList *)request)->header).arena != arena) {
            pcVar7 = "Check failed: next->header.arena == arena: bad arena pointer in Next()\n";
            uVar5 = 0x47;
            goto LAB_001255b5;
          }
          if (head != pAVar6) {
            if (request <= pAVar6) {
              pcVar7 = "Check failed: prev < next: unordered freelist\n";
              uVar5 = 0x2e;
              goto LAB_001255b5;
            }
            if (request <= (AllocList *)((long)pAVar6->next + (pAVar6->header).size + -0x28)) {
              pcVar7 = 
              "Check failed: reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next): malformed freelist\n"
              ;
              uVar5 = 0x76;
              goto LAB_001255b5;
            }
          }
          bVar9 = true;
          if (((AllocList *)request == (AllocList *)0x0) ||
             (pAVar6 = (AllocList *)request, size <= (ulong)(((AllocList *)request)->header).size))
          goto LAB_0012544f;
        }
        bVar9 = false;
LAB_0012544f:
        if ((AllocList *)request == (AllocList *)0x0) goto LAB_00125454;
      }
    } while (!bVar9);
    LLA_SkiplistDelete(head,(AllocList *)request,&local_138);
    uVar2 = (((AllocList *)request)->header).size;
    if (arena->min_size + size <= uVar2) {
      plVar1 = (long *)((long)((AllocList *)request)->next + (size - 0x28));
      *plVar1 = uVar2 - size;
      plVar1[1] = (long)((AllocList *)request)->next + (size - 0x28) ^ 0x4c833e95;
      plVar1[2] = (long)arena;
      (((AllocList *)request)->header).size = size;
      AddToFreelist(plVar1 + 4,arena);
    }
    (((AllocList *)request)->header).magic = request ^ 0x4c833e95;
    if ((((AllocList *)request)->header).arena != arena) {
      pcVar7 = "Check failed: s->header.arena == arena: \n";
      uVar5 = 0x29;
LAB_001255b5:
      syscall(1,2,pcVar7,uVar5);
      abort();
    }
    arena->allocation_count = arena->allocation_count + 1;
    piVar8 = &((AllocList *)request)->levels;
    SpinLockHolder::~SpinLockHolder(&local_38);
  }
  return piVar8;
}

Assistant:

void *LowLevelAlloc::AllocWithArena(size_t request, Arena *arena) {
  if (!request) {
    return nullptr;
  }

  if (!arena) {
    arena = DefaultArena();
  }

  AllocList *s;       // will point to region that satisfies request
  SpinLockHolder locker{&arena->mu};

  // round up with header
  size_t req_rnd = RoundUp(request + sizeof (s->header), arena->roundup);
  for (;;) {      // loop until we find a suitable region
    // find the minimum levels that a block of this size must have
    int i = LLA_SkiplistLevels(req_rnd, arena->min_size, false) - 1;
    if (i < arena->freelist.levels) {   // potential blocks exist
      AllocList *before = &arena->freelist;  // predecessor of s
      while ((s = Next(i, before, arena)) != 0 && s->header.size < req_rnd) {
        before = s;
      }
      if (s != 0) {       // we found a region
        break;
      }
    }
    // we unlock before mmap() both because mmap() may call a callback hook,
    // and because it may be slow.
    arena->mu.Unlock();

    size_t new_pages_size = RoundUp(req_rnd, kMinimalRegion);
    void *new_pages;
    std::tie(new_pages, new_pages_size) = arena->allocator->MapPages(new_pages_size);

    arena->mu.Lock();
    arena->InsertAllocatedMemoryLocked(new_pages, new_pages_size);
  }
  AllocList *prev[kMaxLevel];
  LLA_SkiplistDelete(&arena->freelist, s, prev);    // remove from free list
  // s points to the first free region that's big enough
  if (req_rnd + arena->min_size <= s->header.size) {  // big enough to split
    AllocList *n = reinterpret_cast<AllocList *>
      (req_rnd + reinterpret_cast<char *>(s));
    n->header.size = s->header.size - req_rnd;
    n->header.magic = Magic(kMagicAllocated, &n->header);
    n->header.arena = arena;
    s->header.size = req_rnd;
    AddToFreelist(&n->levels, arena);
  }
  s->header.magic = Magic(kMagicAllocated, &s->header);
  RAW_CHECK(s->header.arena == arena, "");
  arena->allocation_count++;

  return &s->levels;
}